

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O3

void __thiscall
opengv::math::Sturm::computeNegatedRemainder(Sturm *this,MatrixXd *p1,MatrixXd *p2,MatrixXd *r)

{
  long lVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  MatrixXd poly_2;
  MatrixXd poly_1;
  MatrixXd poly_3;
  DstEvaluatorType dstEvaluator;
  ActualDstType actualDst;
  SrcEvaluatorType srcEvaluator;
  assign_op<double,_double> local_149;
  DenseStorage<double,__1,__1,__1,_0> local_148;
  DenseStorage<double,__1,__1,__1,_0> local_128;
  DenseStorage<double,__1,__1,__1,_0> local_108;
  DstEvaluatorType local_f0;
  MatrixXd *local_d8;
  SrcEvaluatorType local_d0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_a8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_50;
  
  lVar1 = (p1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  local_128.m_cols = 0;
  local_128.m_data = (double *)0x0;
  local_128.m_rows = 0;
  if ((lVar1 != 0) &&
     (auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar3 / SEXT816(lVar1),0) < 1)) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8,p1,SUB168(auVar3 % SEXT816(lVar1),0));
    *puVar2 = acos;
    __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_d8 = r;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_128,lVar1,1,lVar1);
  local_d0.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.data =
       (p2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  local_a8.m_lhs.m_lhs._0_8_ =
       (p2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  local_50.m_dst = &local_f0;
  local_d0.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.lhsImpl.
  super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  .m_functor.m_other =
       *(p1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data /
       *local_d0.
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.data
  ;
  local_a8._0_8_ = local_128.m_data;
  local_a8.m_lhs._0_8_ = 1;
  local_a8.m_lhs.m_lhs.m_lhs._8_8_ = 0;
  local_a8.m_lhs.m_lhs.m_rhs = (RhsNested)0x0;
  local_a8.m_lhs.m_lhs._32_8_ = local_128.m_rows;
  local_d0.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
  m_outerStride =
       (p2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  local_f0.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_data = local_128.m_data;
  local_f0.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_outerStride.m_value = local_128.m_rows;
  local_50.m_functor = (assign_op<double,_double> *)&local_148;
  local_a8.m_lhs.m_lhs.m_lhs.m_xpr = (XprTypeNested)&local_128;
  local_50.m_src = &local_d0;
  local_50.m_dstExpr = (DstXprType *)&local_a8;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
  ::run(&local_50);
  lVar1 = (p1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  local_128.m_data[(lVar1 + -1) * local_128.m_rows] = 0.0;
  local_148.m_cols = 0;
  local_148.m_data = (double *)0x0;
  local_148.m_rows = 0;
  if ((lVar1 != 0) &&
     (auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar3 / SEXT816(lVar1),0) < 1)) {
    puVar2 = (undefined8 *)
             __cxa_allocate_exception(8,local_128.m_data,SUB168(auVar3 % SEXT816(lVar1),0));
    *puVar2 = acos;
    __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_148,lVar1,1,lVar1);
  local_d0.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.data =
       (p2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  local_a8.m_lhs.m_lhs._0_8_ =
       (p2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  local_f0.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_data = local_148.m_data + local_148.m_rows;
  local_50.m_dst = &local_f0;
  local_d0.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.lhsImpl.
  super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  .m_functor.m_other =
       (p1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
       [(p1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows] /
       *local_d0.
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.data
  ;
  local_a8.m_lhs._0_8_ = 1;
  local_a8.m_lhs.m_lhs.m_lhs._8_8_ = 0;
  local_a8.m_lhs.m_lhs.m_rhs = (RhsNested)0x1;
  local_a8.m_lhs.m_lhs._32_8_ = local_148.m_rows;
  local_d0.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
  m_outerStride =
       (p2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  local_f0.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_outerStride.m_value = local_148.m_rows;
  local_50.m_functor = (assign_op<double,_double> *)&local_108;
  local_a8._0_8_ =
       local_f0.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
       .
       super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
       .m_data;
  local_a8.m_lhs.m_lhs.m_lhs.m_xpr = (XprTypeNested)&local_148;
  local_50.m_src = &local_d0;
  local_50.m_dstExpr = (DstXprType *)&local_a8;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
  ::run(&local_50);
  *local_148.m_data = 0.0;
  lVar1 = (p1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  local_108.m_cols = 0;
  local_108.m_data = (double *)0x0;
  local_108.m_rows = 0;
  if ((lVar1 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar1),0) < 1)) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = acos;
    __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_108,lVar1,1,lVar1);
  local_d0.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.data =
       (p2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  local_d0.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
  m_outerStride =
       (p2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_d0.
                 super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                 .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 .m_d.data[local_d0.
                           super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                           .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           .m_d.m_outerStride];
  local_f0.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_data = local_108.m_data + local_108.m_rows;
  auVar3._8_8_ = 0x8000000000000000;
  auVar3._0_8_ = 0x8000000000000000;
  auVar3 = vxorpd_avx512vl(auVar4,auVar3);
  local_a8.m_lhs.m_lhs._0_8_ =
       (p2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  local_a8.m_lhs._0_8_ = 1;
  local_f0.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_outerStride.m_value = local_108.m_rows;
  local_50.m_dst = &local_f0;
  local_a8.m_lhs.m_lhs.m_lhs._8_8_ = 0;
  local_a8.m_lhs.m_lhs.m_rhs = (RhsNested)0x1;
  local_a8.m_lhs.m_lhs._32_8_ = local_108.m_rows;
  local_d0.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.lhsImpl.
  super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  .m_functor.m_other =
       (auVar3._0_8_ *
       *(p1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data) /
       (*local_d0.
         super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
         .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
         data * *local_d0.
                 super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                 .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 .m_d.data);
  local_50.m_functor = &local_149;
  local_a8._0_8_ =
       local_f0.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
       .
       super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
       .m_data;
  local_a8.m_lhs.m_lhs.m_lhs.m_xpr = (XprTypeNested)&local_108;
  local_50.m_src = &local_d0;
  local_50.m_dstExpr = (DstXprType *)&local_a8;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
  ::run(&local_50);
  local_a8.m_lhs.m_lhs.m_rhs = (RhsNested)&local_128;
  local_a8.m_lhs.m_rhs = (RhsNested)&local_148;
  *local_108.m_data = 0.0;
  local_a8.m_lhs.m_lhs.m_lhs.m_xpr = p1;
  local_a8.m_rhs = (RhsNested)&local_108;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::internal::assign_op<double,double>>
            (local_d8,&local_a8,(assign_op<double,_double> *)&local_d0);
  if (local_108.m_data != (double *)0x0) {
    free((void *)local_108.m_data[-1]);
  }
  if (local_148.m_data != (double *)0x0) {
    free((void *)local_148.m_data[-1]);
  }
  if (local_128.m_data != (double *)0x0) {
    free((void *)local_128.m_data[-1]);
  }
  return;
}

Assistant:

void
opengv::math::Sturm::computeNegatedRemainder(
    const Eigen::MatrixXd & p1,
    const Eigen::MatrixXd & p2,
    Eigen::MatrixXd & r )
{
  //we have to create 3 subtraction polynomials
  Eigen::MatrixXd poly_1(1,p1.cols());
  poly_1.block(0,0,1,p2.cols()) = (p1(0,0)/p2(0,0)) * p2;
  poly_1(0,p1.cols()-1) = 0.0;

  Eigen::MatrixXd poly_2(1,p1.cols());
  poly_2.block(0,1,1,p2.cols()) = (p1(0,1)/p2(0,0)) * p2;
  poly_2(0,0) = 0.0;

  Eigen::MatrixXd poly_3(1,p1.cols());
  poly_3.block(0,1,1,p2.cols()) = (-p2(0,1)*p1(0,0)/pow(p2(0,0),2)) * p2;
  poly_3(0,0) = 0.0;

  //compute remainder
  r = -p1 + poly_1 + poly_2 + poly_3;
}